

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O3

void __thiscall QtMWidgets::TextLabel::paintEvent(TextLabel *this,QPaintEvent *e)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  qreal qVar6;
  double in_XMM1_Qa;
  QPainter p;
  QRect cr;
  undefined1 local_60 [8];
  undefined1 local_58 [16];
  double local_48;
  double local_40;
  
  QFrame::paintEvent((QPaintEvent *)this);
  QPainter::QPainter((QPainter *)local_60,(QPaintDevice *)&this->field_0x10);
  local_58 = QWidget::contentsRect();
  QPainter::setClipRect(local_60,local_58,1);
  QPainter::setPen((QColor *)local_60);
  QStaticText::textOption();
  QTextOption::~QTextOption((QTextOption *)&local_48);
  iVar1 = ((this->d).d)->margin;
  iVar5 = local_58._0_4_;
  uVar2 = local_58._12_4_;
  if ((local_48._0_4_ & 0x1e0) == 0x40) {
    QStaticText::size();
    iVar3 = uVar2 - ((int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | (ulong)DAT_00181940) +
                          in_XMM1_Qa) + ((this->d).d)->margin);
    qVar6 = (qreal)(ulong)(uint)(iVar1 + iVar5);
  }
  else {
    iVar3 = local_58._4_4_;
    if ((local_48._0_4_ & 0x1e0) == 0x80) {
      QStaticText::size();
      iVar4 = uVar2 - iVar3;
      iVar3 = (((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) + iVar3) -
              (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | (ulong)DAT_00181940) +
                   in_XMM1_Qa) / 2;
      qVar6 = (qreal)(ulong)(uint)(iVar1 + iVar5);
    }
    else {
      qVar6 = (qreal)local_58._0_8_;
      if (iVar1 != 0) {
        qVar6 = (qreal)(ulong)(uint)(iVar5 + iVar1);
        iVar3 = iVar3 + iVar1;
      }
    }
  }
  local_48 = (double)SUB84(qVar6,0);
  local_40 = (double)iVar3;
  QPainter::drawStaticText((QPointF *)local_60,(QStaticText *)&local_48);
  QPainter::~QPainter((QPainter *)local_60);
  return;
}

Assistant:

void
TextLabel::paintEvent( QPaintEvent * e )
{
	QFrame::paintEvent( e );

	QPainter p( this );
	const QRect cr = contentsRect();

	p.setClipRect( cr );
	p.setPen( d->color );

	int vAlign = d->staticText.textOption().alignment() & Qt::AlignVertical_Mask;

	QPoint topLeft = cr.topLeft();

	switch( vAlign )
	{
		case Qt::AlignBottom :
			topLeft = QPoint( topLeft.x() + d->margin,
				cr.bottomLeft().y() - qRound( d->staticText.size().height() ) -
				d->margin );
		break;

		case Qt::AlignVCenter :
			topLeft = QPoint( topLeft.x() + d->margin,
				topLeft.y() + cr.height() / 2 -
					qRound( d->staticText.size().height() ) / 2 );
		break;

		default :
		{
			if( d->margin != 0 )
				topLeft += QPoint( d->margin, d->margin );
		}
		break;
	}

	p.drawStaticText( topLeft, d->staticText );
}